

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O2

void __thiscall
SStringViewInit_Short_Test<(anonymous_namespace)::string_maker<const_char_*>_>::
~SStringViewInit_Short_Test
          (SStringViewInit_Short_Test<(anonymous_namespace)::string_maker<const_char_*>_> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SStringViewInit, Short) {
    using namespace pstore;
    TypeParam t;
    std::string const src{"hello"};
    auto ptr = t (src);
    auto sv = make_sstring_view (std::move (ptr), src.length ());
    EXPECT_EQ (sv.size (), 5U);
    EXPECT_EQ (sv.length (), 5U);
    EXPECT_EQ (sv.max_size (), std::numeric_limits<std::size_t>::max ());
    EXPECT_FALSE (sv.empty ());
    EXPECT_EQ (std::distance (std::begin (sv), std::end (sv)), 5);
}